

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O3

void __thiscall
slang::ast::BinaryAssertionExpr::serializeTo(BinaryAssertionExpr *this,ASTSerializer *serializer)

{
  size_t __n;
  
  __n = strlen(*(char **)(toString(slang::ast::BinaryAssertionOperator)::strings +
                         (long)(int)this->op * 8));
  ASTSerializer::write(serializer,2,"op",__n);
  ASTSerializer::write(serializer,4,"left",(size_t)this->left);
  ASTSerializer::write(serializer,5,"right",(size_t)this->right);
  return;
}

Assistant:

void BinaryAssertionExpr::serializeTo(ASTSerializer& serializer) const {
    serializer.write("op", toString(op));
    serializer.write("left", left);
    serializer.write("right", right);
}